

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

Interval __thiscall pbrt::Interval::operator*(Interval *this,Interval i)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  float local_20 [2];
  int local_18;
  int local_14;
  float local_10 [2];
  int local_8;
  int local_4;
  
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = i;
  fVar1 = i.low * this->low;
  auVar13 = ZEXT1664(SUB6416(ZEXT464(0xff800000),0));
  if (-INFINITY < fVar1) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT816(0) << 0x20,0);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar10 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar1);
    auVar13 = ZEXT464((int)fVar10 + -1 + (uint)(fVar10 <= 0.0) * 2);
  }
  local_8 = -0x800000;
  local_10[1] = -INFINITY;
  fVar10 = i.low * this->high;
  if (-INFINITY < fVar10) {
    auVar14._0_8_ = SUB648(ZEXT464(0xff800000),0) ^ 0xff800000;
    auVar14._8_8_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar10),auVar14,0);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar3 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar10);
    local_10[1] = (float)((int)fVar3 + -1 + (uint)(fVar3 <= (float)auVar14._0_8_) * 2);
  }
  auVar14 = vmovshdup_avx(auVar12._0_16_);
  fVar3 = auVar14._0_4_ * this->low;
  if (-INFINITY < fVar3) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar3),ZEXT816(0) << 0x40,0);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar4 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar3);
    local_8 = (int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2;
  }
  fVar4 = auVar14._0_4_ * this->high;
  local_4 = -0x800000;
  if (-INFINITY < fVar4) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar4),ZEXT816(0) << 0x20,0);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar5 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar4);
    local_4 = (int)fVar5 + -1 + (uint)(fVar5 <= 0.0) * 2;
  }
  auVar12 = ZEXT464(0x7f800000);
  if (fVar1 < INFINITY) {
    auVar11._0_12_ = ZEXT812(0);
    auVar11._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar11,0);
    fVar1 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar1);
    auVar12 = ZEXT464((-(uint)(fVar1 < 0.0) | 1) + (int)fVar1);
  }
  local_18 = 0x7f800000;
  local_20[1] = INFINITY;
  if (fVar10 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar10),ZEXT816(0) << 0x40,0);
    fVar10 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar10);
    local_20[1] = (float)((-(uint)(fVar10 < 0.0) | 1) + (int)fVar10);
  }
  if (fVar3 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar3),ZEXT816(0) << 0x40,0);
    fVar3 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar3);
    local_18 = (-(uint)(fVar3 < 0.0) | 1) + (int)fVar3;
  }
  local_14 = 0x7f800000;
  if (fVar4 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar4),ZEXT816(0) << 0x40,0);
    fVar4 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar4);
    local_14 = (-(uint)(fVar4 < 0.0) | 1) + (int)fVar4;
  }
  pfVar9 = local_10;
  local_10[0] = auVar13._0_4_;
  lVar7 = 4;
  do {
    fVar1 = *(float *)((long)local_10 + lVar7);
    fVar10 = auVar13._0_4_;
    auVar14 = vminss_avx(ZEXT416((uint)fVar1),auVar13._0_16_);
    auVar13 = ZEXT1664(auVar14);
    if (fVar1 < fVar10) {
      pfVar9 = (float *)((long)local_10 + lVar7);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  pfVar8 = local_20;
  lVar7 = 4;
  local_20[0] = auVar12._0_4_;
  do {
    fVar1 = *(float *)((long)local_20 + lVar7);
    fVar10 = auVar12._0_4_;
    auVar14 = vmaxss_avx(ZEXT416((uint)fVar1),auVar12._0_16_);
    auVar12 = ZEXT1664(auVar14);
    if (fVar10 < fVar1) {
      pfVar8 = (float *)((long)local_20 + lVar7);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  auVar11 = vminss_avx(ZEXT416((uint)*pfVar8),ZEXT416((uint)*pfVar9));
  auVar14 = vmaxss_avx(ZEXT416((uint)*pfVar8),ZEXT416((uint)*pfVar9));
  auVar14 = vinsertps_avx(auVar11,auVar14,0x10);
  return auVar14._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Interval operator*(Interval i) const {
        Float lp[4] = {MulRoundDown(low, i.low), MulRoundDown(high, i.low),
                       MulRoundDown(low, i.high), MulRoundDown(high, i.high)};
        Float hp[4] = {MulRoundUp(low, i.low), MulRoundUp(high, i.low),
                       MulRoundUp(low, i.high), MulRoundUp(high, i.high)};
        return {std::min({lp[0], lp[1], lp[2], lp[3]}),
                std::max({hp[0], hp[1], hp[2], hp[3]})};
    }